

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

int fetch_escaped_value_raw(OnigUChar **src,OnigUChar *end,ParseEnv *env,OnigCodePoint *val)

{
  OnigEncoding pOVar1;
  OnigSyntaxType *pOVar2;
  OnigCodePoint OVar3;
  int iVar4;
  uint uVar5;
  OnigUChar *pOVar6;
  OnigCodePoint local_4c;
  OnigUChar *local_48;
  OnigUChar **local_40;
  OnigCodePoint *local_38;
  
  pOVar6 = *src;
  if (end <= pOVar6) {
    return -0x68;
  }
  pOVar1 = env->enc;
  local_40 = src;
  local_38 = val;
  OVar3 = (*pOVar1->mbc_to_code)(pOVar6,end);
  iVar4 = (*pOVar1->mbc_enc_len)(pOVar6);
  pOVar6 = pOVar6 + iVar4;
  pOVar2 = env->syntax;
  local_48 = pOVar6;
  if (OVar3 == 0x43) {
    if ((pOVar2->op2 & 0x800) != 0) {
      if (end <= pOVar6) {
        return -0x6a;
      }
      OVar3 = (*pOVar1->mbc_to_code)(pOVar6,end);
      iVar4 = (*pOVar1->mbc_enc_len)(pOVar6);
      if (OVar3 != 0x2d) {
        return -0x6d;
      }
      pOVar6 = pOVar6 + iVar4;
LAB_0011358d:
      if (end <= pOVar6) {
        return -0x6a;
      }
      OVar3 = (*pOVar1->mbc_to_code)(pOVar6,end);
      local_4c = OVar3;
      iVar4 = (*pOVar1->mbc_enc_len)(pOVar6);
      local_48 = pOVar6 + iVar4;
      uVar5 = 0x7f;
      if (OVar3 != 0x3f) {
        if ((OVar3 == (env->syntax->meta_char_table).esc) &&
           (iVar4 = fetch_escaped_value_raw(&local_48,end,env,&local_4c), OVar3 = local_4c,
           iVar4 < 0)) {
          return iVar4;
        }
        uVar5 = OVar3 & 0x9f;
      }
      goto LAB_001135ff;
    }
  }
  else if (OVar3 == 99) {
    if ((pOVar2->op & 0x8000000) != 0) goto LAB_0011358d;
  }
  else if ((OVar3 == 0x4d) && ((pOVar2->op2 & 0x1000) != 0)) {
    if (end <= pOVar6) {
      return -0x69;
    }
    OVar3 = (*pOVar1->mbc_to_code)(pOVar6,end);
    iVar4 = (*pOVar1->mbc_enc_len)(pOVar6);
    if (OVar3 != 0x2d) {
      return -0x6c;
    }
    pOVar6 = pOVar6 + iVar4;
    if (end <= pOVar6) {
      return -0x69;
    }
    OVar3 = (*pOVar1->mbc_to_code)(pOVar6,end);
    local_4c = OVar3;
    iVar4 = (*pOVar1->mbc_enc_len)(pOVar6);
    local_48 = pOVar6 + iVar4;
    if ((OVar3 == (env->syntax->meta_char_table).esc) &&
       (iVar4 = fetch_escaped_value_raw(&local_48,end,env,&local_4c), OVar3 = local_4c, iVar4 < 0))
    {
      return iVar4;
    }
    uVar5 = OVar3 & 0xff | 0x80;
    goto LAB_001135ff;
  }
  if ((pOVar2->op & 0x4000000) == 0) goto switchD_00113642_caseD_6f;
  switch(OVar3) {
  case 0x61:
    uVar5 = 7;
    break;
  case 0x62:
    uVar5 = 8;
    break;
  case 99:
  case 100:
    goto switchD_00113642_caseD_6f;
  case 0x65:
    uVar5 = 0x1b;
    break;
  case 0x66:
    uVar5 = 0xc;
    break;
  default:
    switch(OVar3) {
    case 0x6e:
      uVar5 = 10;
      break;
    case 0x72:
      uVar5 = 0xd;
      break;
    case 0x74:
      uVar5 = 9;
      break;
    case 0x76:
      uVar5 = 0xb;
      if ((pOVar2->op2 & 0x2000) != 0) break;
    default:
switchD_00113642_caseD_6f:
      uVar5 = OVar3;
    }
  }
LAB_001135ff:
  *local_40 = local_48;
  *local_38 = uVar5;
  return 0;
}

Assistant:

static int
fetch_escaped_value_raw(UChar** src, UChar* end, ParseEnv* env,
                        OnigCodePoint* val)
{
  int v;
  OnigCodePoint c;
  OnigEncoding enc = env->enc;
  UChar* p = *src;

  if (PEND) return ONIGERR_END_PATTERN_AT_ESCAPE;

  PFETCH_S(c);
  switch (c) {
  case 'M':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_M_BAR_META)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_META_CODE_SYNTAX;
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c == MC_ESC(env->syntax)) {
        v = fetch_escaped_value_raw(&p, end, env, &c);
        if (v < 0) return v;
      }
      c = ((c & 0xff) | 0x80);
    }
    else
      goto backslash;
    break;

  case 'C':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_C_BAR_CONTROL)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_CONTROL_CODE_SYNTAX;
      goto control;
    }
    else
      goto backslash;

  case 'c':
    if (IS_SYNTAX_OP(env->syntax, ONIG_SYN_OP_ESC_C_CONTROL)) {
    control:
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c == '?') {
        c = 0177;
      }
      else {
        if (c == MC_ESC(env->syntax)) {
          v = fetch_escaped_value_raw(&p, end, env, &c);
          if (v < 0) return v;
        }
        c &= 0x9f;
      }
      break;
    }
    /* fall through */

  default:
    {
    backslash:
      c = conv_backslash_value(c, env);
    }
    break;
  }

  *src = p;
  *val = c;
  return 0;
}